

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O2

size_type chain::str::find<(chain::str::case_t)0>
                    (string_view haystack,string_view needle,size_t pos)

{
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = haystack._M_str;
  local_10._M_len = haystack._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    (&local_10,needle._M_str,pos,needle._M_len);
  return sVar1;
}

Assistant:

auto find(std::string_view haystack, std::string_view needle, std::size_t pos = 0) -> std::string_view::size_type
{
    if constexpr (case_type == case_t::sensitive)
    {
        return haystack.find(needle, pos);
    }
    else
    {
        auto it = std::search(
            haystack.begin() + pos, haystack.end(), needle.begin(), needle.end(), equal_uchar<case_t::insensitive>);

        if (it != haystack.end())
        {
            return it - haystack.begin();
        }
        else
        {
            return std::string_view::npos;
        }
    }
}